

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_inline_table<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  table_format_info fmt_00;
  ulong uVar1;
  bool bVar2;
  char_type_conflict cVar3;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *pvVar4;
  multiline_spacer<toml::type_config> *pmVar5;
  size_type sVar6;
  value_type *ppbVar7;
  size_type sVar8;
  region_type *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  basic_value<toml::type_config> retval;
  source_location src_3;
  basic_value<toml::type_config> *in_stack_000007d8;
  region *in_stack_000007e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000007e8;
  table_type *in_stack_000007f0;
  inserting_value_kind in_stack_000007ff;
  bool comment_found;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  size_t i_1;
  size_t i;
  char_type_conflict c;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  type val;
  type key_reg;
  type keys;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  kv_res;
  source_location src_2;
  source_location src_1;
  bool comma_found;
  bool still_empty;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  table_format_info fmt;
  table_type table;
  source_location src;
  spec *spec;
  location first;
  size_type num_errors;
  undefined7 in_stack_ffffffffffffe988;
  char_type in_stack_ffffffffffffe98f;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_ffffffffffffe990;
  size_t in_stack_ffffffffffffe998;
  size_type sVar9;
  location *in_stack_ffffffffffffe9a0;
  error_info *in_stack_ffffffffffffe9a8;
  error_info *in_stack_ffffffffffffe9b0;
  undefined7 in_stack_ffffffffffffe9b8;
  undefined1 in_stack_ffffffffffffe9bf;
  int in_stack_ffffffffffffe9c0;
  undefined2 in_stack_ffffffffffffe9c4;
  char_type_conflict in_stack_ffffffffffffe9c6;
  char_type_conflict in_stack_ffffffffffffe9c7;
  char *in_stack_ffffffffffffe9c8;
  region_type *in_stack_ffffffffffffe9d0;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  *in_stack_ffffffffffffe9e8;
  source_location in_stack_ffffffffffffe9f0;
  location *in_stack_ffffffffffffe9f8;
  region *in_stack_ffffffffffffea00;
  region *in_stack_ffffffffffffea08;
  undefined7 in_stack_ffffffffffffea10;
  undefined1 in_stack_ffffffffffffea17;
  region_type *in_stack_ffffffffffffea18;
  error_type *in_stack_ffffffffffffea20;
  context<toml::type_config> *in_stack_ffffffffffffea28;
  basic_value<toml::type_config> *in_stack_ffffffffffffea30;
  multiline_spacer<toml::type_config> *in_stack_ffffffffffffea38;
  multiline_spacer<toml::type_config> *in_stack_ffffffffffffea40;
  basic_value<toml::type_config> *in_stack_ffffffffffffea78;
  string *in_stack_ffffffffffffeb48;
  string *msg;
  source_location *in_stack_ffffffffffffeb50;
  source_location *loc_00;
  undefined7 in_stack_ffffffffffffeb58;
  char_type_conflict in_stack_ffffffffffffeb5f;
  undefined1 in_stack_ffffffffffffec8f;
  context<toml::type_config> *in_stack_ffffffffffffec90;
  location *in_stack_ffffffffffffec98;
  context<toml::type_config> *in_stack_ffffffffffffede0;
  location *in_stack_ffffffffffffede8;
  undefined1 local_11b0 [255];
  allocator<char> local_10b1 [401];
  context<toml::type_config> *in_stack_fffffffffffff0e0;
  location *in_stack_fffffffffffff0e8;
  char local_ef8 [128];
  undefined **local_e78;
  undefined **local_e70;
  undefined **local_e68;
  undefined1 local_e59;
  undefined **local_e58;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  local_df8;
  context<toml::type_config> local_d98 [2];
  undefined **local_d20;
  ulong local_d18;
  undefined **local_ce8;
  ulong local_ce0;
  char_type_conflict local_cd1;
  undefined **local_cd0;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> local_b40;
  undefined **local_ae0;
  undefined **local_a10;
  undefined **local_9a0;
  result local_980 [343];
  allocator<char> local_829 [160];
  allocator<char> local_789 [440];
  string local_5d1 [5];
  source_location local_531 [3];
  byte local_37a;
  byte local_379;
  optional<toml::detail::multiline_spacer<toml::type_config>_> local_348;
  table_format_info local_320 [4];
  int local_2d8;
  allocator<char> local_2d1 [160];
  allocator<char> local_231 [449];
  spec *local_70;
  size_type local_20;
  region_type *local_18;
  
  local_18 = in_RDX;
  pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)in_RDX);
  local_20 = std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
  location::location((location *)in_stack_ffffffffffffe9b0,(location *)in_stack_ffffffffffffe9a8);
  local_70 = context<toml::type_config>::toml_spec((context<toml::type_config> *)local_18);
  bVar2 = location::eof((location *)in_stack_ffffffffffffe990);
  if ((bVar2) ||
     (cVar3 = location::current((location *)
                                CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988)),
     cVar3 != '{')) {
    region::region(in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
    source_location::source_location
              ((source_location *)CONCAT17(in_stack_ffffffffffffea17,in_stack_ffffffffffffea10),
               in_stack_ffffffffffffea08);
    region::~region((region *)in_stack_ffffffffffffe990);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffe9c7,
                        CONCAT16(in_stack_ffffffffffffe9c6,
                                 CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0))));
    source_location::source_location
              ((source_location *)in_stack_ffffffffffffe990,
               (source_location *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffe9c7,
                        CONCAT16(in_stack_ffffffffffffe9c6,
                                 CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0))));
    make_error_info<>((string *)CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
                      in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
    err<toml::error_info>((error_info *)in_stack_ffffffffffffe9e8);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_ffffffffffffe990,
               (failure_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x747311);
    error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe990);
    std::allocator<char>::~allocator(local_2d1);
    source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe990);
    std::allocator<char>::~allocator(local_231);
    local_2d8 = 1;
    source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
  }
  else {
    location::advance(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                     *)0x7474a0);
    table_format_info::table_format_info(local_320);
    local_320[0].fmt = oneline;
    local_320[0].indent_type = none;
    cxx::make_nullopt();
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::optional(&local_348);
    if ((local_70->v1_1_0_allow_newlines_in_inline_tables & 1U) == 0) {
      skip_whitespace<toml::type_config>
                ((location *)in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
    }
    else {
      skip_multiline_spacer<toml::type_config>
                (in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,(bool)in_stack_ffffffffffffec8f
                );
      std::optional<toml::detail::multiline_spacer<toml::type_config>_>::operator=
                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                 in_stack_ffffffffffffe990,
                 (optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                 CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
      std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x747524);
      bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x747531);
      if ((bVar2) &&
         (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_ffffffffffffe990), (pmVar5->newline_found & 1U) != 0)) {
        local_320[0].fmt = multiline_oneline;
      }
    }
    local_379 = 1;
    local_37a = 0;
    while (bVar2 = location::eof((location *)in_stack_ffffffffffffe990), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      in_stack_ffffffffffffeb5f =
           location::current((location *)
                             CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
      if (in_stack_ffffffffffffeb5f == '}') {
        if (((local_37a & 1) != 0) &&
           ((local_70->v1_1_0_allow_trailing_comma_in_inline_tables & 1U) == 0)) {
          region::region(in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
          source_location::source_location
                    ((source_location *)
                     CONCAT17(in_stack_ffffffffffffea17,in_stack_ffffffffffffea10),
                     in_stack_ffffffffffffea08);
          region::~region((region *)in_stack_ffffffffffffe990);
          loc_00 = local_531;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffe9c7,
                              CONCAT16(in_stack_ffffffffffffe9c6,
                                       CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)
                                      )));
          source_location::source_location
                    ((source_location *)in_stack_ffffffffffffe990,
                     (source_location *)
                     CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
          msg = local_5d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffe9c7,
                              CONCAT16(in_stack_ffffffffffffe9c6,
                                       CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)
                                      )));
          make_error_info<>((string *)CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
                            loc_00,msg);
          err<toml::error_info>((error_info *)in_stack_ffffffffffffe9e8);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_ffffffffffffe990,
                     (failure_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x747728);
          error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe990);
          std::allocator<char>::~allocator((allocator<char> *)local_5d1);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe990);
          std::allocator<char>::~allocator((allocator<char> *)local_531);
          local_2d8 = 1;
          source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
          goto LAB_00748e15;
        }
        if (((((local_70->v1_1_0_allow_newlines_in_inline_tables & 1U) != 0) &&
             (bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                 0x74789e), bVar2)) &&
            (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                 in_stack_ffffffffffffe990), (pmVar5->newline_found & 1U) != 0)) &&
           (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_ffffffffffffe990), pmVar5->indent_type != none)) {
          pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_ffffffffffffe990);
          local_320[0].indent_type = pmVar5->indent_type;
          pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_ffffffffffffe990);
          local_320[0].closing_indent = pmVar5->indent;
        }
        break;
      }
      if (((local_37a & 1) == 0) && ((local_379 & 1) == 0)) {
        region::region(in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
        source_location::source_location
                  ((source_location *)CONCAT17(in_stack_ffffffffffffea17,in_stack_ffffffffffffea10),
                   in_stack_ffffffffffffea08);
        region::~region((region *)in_stack_ffffffffffffe990);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                   (allocator<char> *)
                   CONCAT17(in_stack_ffffffffffffe9c7,
                            CONCAT16(in_stack_ffffffffffffe9c6,
                                     CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)))
                  );
        source_location::source_location
                  ((source_location *)in_stack_ffffffffffffe990,
                   (source_location *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                   (allocator<char> *)
                   CONCAT17(in_stack_ffffffffffffe9c7,
                            CONCAT16(in_stack_ffffffffffffe9c6,
                                     CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)))
                  );
        make_error_info<>((string *)CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
                          in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
        err<toml::error_info>((error_info *)in_stack_ffffffffffffe9e8);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_ffffffffffffe990,
                   (failure_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x747a83);
        error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe990);
        std::allocator<char>::~allocator(local_829);
        source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe990);
        std::allocator<char>::~allocator(local_789);
        local_2d8 = 1;
        source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
        goto LAB_00748e15;
      }
      bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x747be7);
      if (((bVar2) &&
          (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               in_stack_ffffffffffffe990), (pmVar5->newline_found & 1U) != 0)) &&
         (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_ffffffffffffe990), pmVar5->indent_type != none)) {
        pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_ffffffffffffe990);
        local_320[0].indent_type = pmVar5->indent_type;
        pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_ffffffffffffe990);
        local_320[0].body_indent = pmVar5->indent;
      }
      local_379 = 0;
      parse_key_value_pair<toml::type_config>(in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
      bVar2 = toml::result::operator_cast_to_bool(local_980);
      if (bVar2) {
        local_9a0 = &PTR_s__workspace_llm4binary_github_lic_00a7a3c0;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
        ::unwrap(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe990,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        local_a10 = &PTR_s__workspace_llm4binary_github_lic_00a7a3d8;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
        ::unwrap(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
        region::region((region *)in_stack_ffffffffffffe990,
                       (region *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        local_ae0 = &PTR_s__workspace_llm4binary_github_lic_00a7a3f0;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
        ::unwrap(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)
                   CONCAT17(in_stack_ffffffffffffe9c7,
                            CONCAT16(in_stack_ffffffffffffe9c6,
                                     CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)))
                   ,(basic_value<toml::type_config> *)
                    CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8));
        region::region((region *)in_stack_ffffffffffffe990,
                       (region *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)
                   CONCAT17(in_stack_ffffffffffffe9c7,
                            CONCAT16(in_stack_ffffffffffffe9c6,
                                     CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0)))
                   ,(basic_value<toml::type_config> *)
                    CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8));
        insert_value<toml::type_config>
                  (in_stack_000007ff,in_stack_000007f0,in_stack_000007e8,in_stack_000007e0,
                   in_stack_000007d8);
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffe990);
        region::~region((region *)in_stack_ffffffffffffe990);
        bVar2 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::is_err(&local_b40)
        ;
        if (bVar2) {
          local_cd0 = &PTR_s__workspace_llm4binary_github_lic_00a7a408;
          result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                     in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
          error_info::error_info
                    ((error_info *)in_stack_ffffffffffffe990,
                     (error_info *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
          context<toml::type_config>::report_error
                    ((context<toml::type_config> *)in_stack_ffffffffffffe990,
                     (error_info *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
          error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
          while (bVar2 = location::eof((location *)in_stack_ffffffffffffe990),
                ((bVar2 ^ 0xffU) & 1) != 0) {
            local_cd1 = location::current((location *)
                                          CONCAT17(in_stack_ffffffffffffe98f,
                                                   in_stack_ffffffffffffe988));
            if (((local_cd1 == ',') || (local_cd1 == '\n')) || (local_cd1 == '}')) {
              local_37a = local_cd1 == ',';
              break;
            }
            location::advance(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
          }
          local_2d8 = 2;
        }
        else {
          if ((local_70->v1_1_0_allow_newlines_in_inline_tables & 1U) == 0) {
            skip_whitespace<toml::type_config>
                      ((location *)in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
          }
          else {
            bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               0x748046);
            if (bVar2) {
              local_ce0 = 0;
              while( true ) {
                uVar1 = local_ce0;
                std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                           in_stack_ffffffffffffe990);
                sVar6 = preserve_comments::size((preserve_comments *)0x748093);
                if (sVar6 <= uVar1) break;
                local_ce8 = &PTR_s__workspace_llm4binary_github_lic_00a7a420;
                ppbVar7 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                      *)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
                basic_value<toml::type_config>::comments(*ppbVar7);
                std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                           in_stack_ffffffffffffe990);
                preserve_comments::at_abi_cxx11_
                          ((preserve_comments *)in_stack_ffffffffffffe990,
                           CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
                preserve_comments::push_back
                          ((preserve_comments *)in_stack_ffffffffffffe990,
                           (string *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
                local_ce0 = local_ce0 + 1;
              }
            }
            skip_multiline_spacer<toml::type_config>
                      (in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,
                       (bool)in_stack_ffffffffffffec8f);
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::operator=
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       in_stack_ffffffffffffe990,
                       (optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x74819e);
            bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               0x7481ab);
            if (bVar2) {
              local_d18 = 0;
              while( true ) {
                uVar1 = local_d18;
                in_stack_ffffffffffffea78 =
                     (basic_value<toml::type_config> *)
                     std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_ffffffffffffe990);
                sVar6 = preserve_comments::size((preserve_comments *)0x7481f8);
                if (sVar6 <= uVar1) break;
                local_d20 = &PTR_s__workspace_llm4binary_github_lic_00a7a438;
                ppbVar7 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                    ((result<toml::basic_value<toml::type_config>_*,_toml::error_info>
                                      *)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
                basic_value<toml::type_config>::comments(*ppbVar7);
                std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                           in_stack_ffffffffffffe990);
                preserve_comments::at_abi_cxx11_
                          ((preserve_comments *)in_stack_ffffffffffffe990,
                           CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
                preserve_comments::push_back
                          ((preserve_comments *)in_stack_ffffffffffffe990,
                           (string *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
                local_d18 = local_d18 + 1;
              }
              pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffe990);
              if ((pmVar5->newline_found & 1U) != 0) {
                local_320[0].fmt = multiline_oneline;
                in_stack_ffffffffffffea40 =
                     std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_ffffffffffffe990);
                if (in_stack_ffffffffffffea40->indent_type != none) {
                  in_stack_ffffffffffffea38 =
                       std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffe990);
                  local_320[0].indent_type = in_stack_ffffffffffffea38->indent_type;
                  in_stack_ffffffffffffea30 =
                       (basic_value<toml::type_config> *)
                       std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                 ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                  in_stack_ffffffffffffe990);
                  local_320[0].body_indent = *(int32_t *)&in_stack_ffffffffffffea30->field_0x4;
                }
              }
            }
          }
          in_stack_ffffffffffffea28 = local_d98;
          character::character((character *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe98f);
          character::scan((character *)in_stack_ffffffffffffea08,
                          (location *)in_stack_ffffffffffffea00);
          local_37a = region::is_ok((region *)0x7483ca);
          region::~region((region *)in_stack_ffffffffffffe990);
          character::~character((character *)0x7483ed);
          if ((local_70->v1_1_0_allow_newlines_in_inline_tables & 1U) == 0) {
            skip_whitespace<toml::type_config>
                      ((location *)in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
          }
          else {
            parse_comment_line<toml::type_config>
                      (in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
            bVar2 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::is_err(&local_df8);
            if (bVar2) {
              local_e58 = &PTR_s__workspace_llm4binary_github_lic_00a7a450;
              in_stack_ffffffffffffea18 = local_18;
              in_stack_ffffffffffffea20 =
                   result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                 *)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
              error_info::error_info(in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
              context<toml::type_config>::report_error
                        ((context<toml::type_config> *)in_stack_ffffffffffffe990,
                         (error_info *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988)
                        );
              error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
            }
            bVar2 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                    ::is_ok(&local_df8);
            in_stack_ffffffffffffea17 = false;
            if (bVar2) {
              local_e68 = &PTR_s__workspace_llm4binary_github_lic_00a7a468;
              in_stack_ffffffffffffea08 =
                   (region *)
                   result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                             *)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
              in_stack_ffffffffffffea17 =
                   std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x74856e);
            }
            local_e59 = in_stack_ffffffffffffea17;
            if ((bool)in_stack_ffffffffffffea17 != false) {
              local_320[0].fmt = multiline_oneline;
              local_e70 = &PTR_s__workspace_llm4binary_github_lic_00a7a480;
              in_stack_ffffffffffffea00 =
                   (region *)
                   result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                             ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)
                              in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
              in_stack_ffffffffffffe9f0._M_impl =
                   (__impl *)
                   basic_value<toml::type_config>::comments
                             ((basic_value<toml::type_config> *)
                              (in_stack_ffffffffffffea00->source_).
                              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
              local_e78 = &PTR_s__workspace_llm4binary_github_lic_00a7a498;
              in_stack_ffffffffffffe9f8 =
                   (location *)
                   result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                             *)in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
              in_stack_ffffffffffffe9e8 =
                   (result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                    *)std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffe990);
              preserve_comments::push_back
                        ((preserve_comments *)in_stack_ffffffffffffe990,
                         (string *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
            }
            if ((local_37a & 1) != 0) {
              skip_multiline_spacer<toml::type_config>
                        (in_stack_ffffffffffffec98,in_stack_ffffffffffffec90,
                         (bool)in_stack_ffffffffffffec8f);
              std::optional<toml::detail::multiline_spacer<toml::type_config>_>::operator=
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                         in_stack_ffffffffffffe990,
                         (optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                         CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
              std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x748681);
              bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                 0x74868e);
              if ((bVar2) &&
                 (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                     ((optional<toml::detail::multiline_spacer<toml::type_config>_>
                                       *)in_stack_ffffffffffffe990),
                 (pmVar5->newline_found & 1U) != 0)) {
                local_320[0].fmt = multiline_oneline;
              }
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)0x7486c9);
          }
          local_2d8 = 0;
        }
        result<toml::basic_value<toml::type_config>_*,_toml::error_info>::~result
                  ((result<toml::basic_value<toml::type_config>_*,_toml::error_info> *)0x74870b);
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffe990);
        region::~region((region *)in_stack_ffffffffffffe990);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe9a0);
        if (local_2d8 == 0) {
          local_2d8 = 0;
        }
      }
      else {
        in_stack_ffffffffffffe9d0 = local_18;
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
        ::unwrap_err(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0);
        in_stack_ffffffffffffe9c8 = local_ef8;
        error_info::error_info
                  ((error_info *)in_stack_ffffffffffffe990,
                   (error_info *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        context<toml::type_config>::report_error
                  ((context<toml::type_config> *)in_stack_ffffffffffffe990,
                   (error_info *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
        while (((bVar2 = location::eof((location *)in_stack_ffffffffffffe990),
                ((bVar2 ^ 0xffU) & 1) != 0 &&
                (in_stack_ffffffffffffe9c7 =
                      location::current((location *)
                                        CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988
                                                )), in_stack_ffffffffffffe9c7 != '}')) &&
               (((local_70->v1_1_0_allow_newlines_in_inline_tables & 1U) != 0 ||
                (in_stack_ffffffffffffe9c6 =
                      location::current((location *)
                                        CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988
                                                )), in_stack_ffffffffffffe9c6 != '\n'))))) {
          location::advance(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
        }
        local_2d8 = 3;
      }
      result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
      ::~result((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                 *)0x7488b8);
      in_stack_ffffffffffffe9c0 = local_2d8;
      if ((local_2d8 != 0) && (local_2d8 != 2)) break;
    }
    cVar3 = location::current((location *)
                              CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
    if (cVar3 == '}') {
      location::advance(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
      sVar9 = local_20;
      pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)local_18);
      sVar8 = std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
      if (sVar9 < sVar8) {
        context<toml::type_config>::pop_last_error
                  ((context<toml::type_config> *)in_stack_ffffffffffffe9a8);
        in_stack_ffffffffffffe990 =
             (result<toml::basic_value<toml::type_config>,_toml::error_info> *)local_11b0;
        err<toml::error_info>((error_info *)in_stack_ffffffffffffe9e8);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_ffffffffffffe990,
                   (failure_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x748c0e);
        error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
        local_2d8 = 1;
      }
      else {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                         *)in_stack_ffffffffffffe990,
                        (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                         *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x748ca7);
        region::region((region *)
                       CONCAT17(in_stack_ffffffffffffe9c7,
                                CONCAT16(in_stack_ffffffffffffe9c6,
                                         CONCAT24(in_stack_ffffffffffffe9c4,
                                                  in_stack_ffffffffffffe9c0))),
                       (location *)CONCAT17(cVar3,in_stack_ffffffffffffe9b8),
                       (location *)in_stack_ffffffffffffe9b0);
        fmt_00._8_8_ = in_stack_ffffffffffffea40;
        fmt_00._0_8_ = in_stack_ffffffffffffea38;
        basic_value<toml::type_config>::basic_value
                  (in_stack_ffffffffffffea30,(table_type *)in_stack_ffffffffffffea28,fmt_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffea20,in_stack_ffffffffffffea18);
        region::~region((region *)in_stack_ffffffffffffe990);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffe9a0);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                          *)0x748d24);
        ok<toml::basic_value<toml::type_config>>(in_stack_ffffffffffffea78);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_ffffffffffffe990,
                   (success_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
        success<toml::basic_value<toml::type_config>_>::~success
                  ((success<toml::basic_value<toml::type_config>_> *)0x748d5f);
        local_2d8 = 1;
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_ffffffffffffe990);
      }
    }
    else {
      region::region(in_stack_ffffffffffffea00,in_stack_ffffffffffffe9f8);
      source_location::source_location
                ((source_location *)CONCAT17(in_stack_ffffffffffffea17,in_stack_ffffffffffffea10),
                 in_stack_ffffffffffffea08);
      region::~region((region *)in_stack_ffffffffffffe990);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffe9c7,
                          CONCAT16(in_stack_ffffffffffffe9c6,
                                   CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0))));
      source_location::source_location
                ((source_location *)in_stack_ffffffffffffe990,
                 (source_location *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffe9c7,
                          CONCAT16(in_stack_ffffffffffffe9c6,
                                   CONCAT24(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0))));
      make_error_info<>((string *)CONCAT17(in_stack_ffffffffffffeb5f,in_stack_ffffffffffffeb58),
                        in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
      err<toml::error_info>((error_info *)in_stack_ffffffffffffe9e8);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_ffffffffffffe990,
                 (failure_type *)CONCAT17(in_stack_ffffffffffffe98f,in_stack_ffffffffffffe988));
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x748a20);
      error_info::~error_info((error_info *)in_stack_ffffffffffffe990);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe990);
      std::allocator<char>::~allocator((allocator<char> *)(local_11b0 + 0x5f));
      source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe990);
      std::allocator<char>::~allocator(local_10b1);
      local_2d8 = 1;
      source_location::~source_location((source_location *)in_stack_ffffffffffffe990);
    }
LAB_00748e15:
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x748e22);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>
                      *)0x748e2f);
  }
  location::~location((location *)in_stack_ffffffffffffe990);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_inline_table(location& loc, context<TC>& ctx)
{
    using table_type = typename basic_value<TC>::table_type;

    const auto num_errors = ctx.errors().size();

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof() || loc.current() != '{')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "The next token is not an inline table", std::move(src), "here"));
    }
    loc.advance();

    table_type table;
    table_format_info fmt;
    fmt.fmt = table_format::oneline;
    fmt.indent_type = indent_char::none;

    cxx::optional<multiline_spacer<TC>> spacer(cxx::make_nullopt());

    if(spec.v1_1_0_allow_newlines_in_inline_tables)
    {
        spacer = skip_multiline_spacer(loc, ctx);
        if(spacer.has_value() && spacer.value().newline_found)
        {
            fmt.fmt = table_format::multiline_oneline;
        }
    }
    else
    {
        skip_whitespace(loc, ctx);
    }

    bool still_empty = true;
    bool comma_found = false;
    while( ! loc.eof())
    {
        // closing!
        if(loc.current() == '}')
        {
            if(comma_found && ! spec.v1_1_0_allow_trailing_comma_in_inline_tables)
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_inline_table: trailing "
                    "comma is not allowed in TOML-v1.0.0)", std::move(src), "here"));
            }

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value() && spacer.value().newline_found &&
                    spacer.value().indent_type != indent_char::none)
                {
                    fmt.indent_type    = spacer.value().indent_type;
                    fmt.closing_indent = spacer.value().indent;
                }
            }
            break;
        }

        // if we already found a value and didn't found `,` nor `}`, error.
        if( ! comma_found && ! still_empty)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_inline_table: "
                    "expected value-separator `,` or closing `}`",
                    std::move(src), "here"));
        }

        // parse indent.
        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        still_empty = false; // parsing a value...
        if(auto kv_res = parse_key_value_pair<TC>(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                std::addressof(table), keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
                // we need to skip until the next value (or end of the table)
                // because we don't have valid kv pair.
                while( ! loc.eof())
                {
                    const auto c = loc.current();
                    if(c == ',' || c == '\n' || c == '}')
                    {
                        comma_found = (c == ',');
                        break;
                    }
                    loc.advance();
                }
                continue;
            }

            // if comment line follows immediately(without newline) after `,`, then
            // the comment is for the elem. we need to check if comment follows `,`.
            //
            // (key) = (val) (ws|newline|comment-line)? `,` (ws)? (comment)?

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value()) // copy previous comments to value
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                }
                spacer = skip_multiline_spacer(loc, ctx);
                if(spacer.has_value())
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                    if(spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                        if(spacer.value().indent_type != indent_char::none)
                        {
                            fmt.indent_type = spacer.value().indent_type;
                            fmt.body_indent = spacer.value().indent;
                        }
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }

            comma_found = character(',').scan(loc).is_ok();

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                auto com_res = parse_comment_line(loc, ctx);
                if(com_res.is_err())
                {
                    ctx.report_error(com_res.unwrap_err());
                }
                const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
                if(comment_found)
                {
                    fmt.fmt = table_format::multiline_oneline;
                    ins_res.unwrap()->comments().push_back(com_res.unwrap().value());
                }
                if(comma_found)
                {
                    spacer = skip_multiline_spacer(loc, ctx, comment_found);
                    if(spacer.has_value() && spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            while( ! loc.eof())
            {
                if(loc.current() == '}')
                {
                    break;
                }
                if( ! spec.v1_1_0_allow_newlines_in_inline_tables && loc.current() == '\n')
                {
                    break;
                }
                loc.advance();
            }
            break;
        }
    }

    if(loc.current() != '}')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "missing closing bracket `}`",
            std::move(src), "expected `}`, reached line end"));
    }
    else
    {
        loc.advance(); // skip }
    }

    // any error reported from this function
    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }

    basic_value<TC> retval(
        std::move(table), std::move(fmt), {}, region(first, loc));

    return ok(std::move(retval));
}